

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1ceaf2c::InfoWriter::SetConfig(InfoWriter *this,string *key,ConfigString *cfgStr)

{
  _Hash_node_base *p_Var1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined8 local_80;
  undefined1 *local_78;
  _Hash_node_base *local_70;
  _Hash_node_base *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  Set(this,key,&cfgStr->Default);
  p_Var1 = (cfgStr->Config)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_90._M_str = (key->_M_dataplus)._M_p;
      local_90._M_len = key->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x5f;
      local_80 = 1;
      local_68 = p_Var1[1]._M_nxt;
      local_70 = p_Var1[2]._M_nxt;
      views._M_len = 3;
      views._M_array = &local_90;
      local_78 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_b0,views);
      Set(this,&local_b0,(string *)(p_Var1 + 5));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void InfoWriter::SetConfig(std::string const& key,
                           cmQtAutoGenInitializer::ConfigString const& cfgStr)
{
  this->Set(key, cfgStr.Default);
  for (auto const& item : cfgStr.Config) {
    this->Set(cmStrCat(key, '_', item.first), item.second);
  }
}